

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.cpp
# Opt level: O3

void rw::writePNG(Image *image,char *filename)

{
  uint32 srcstride;
  uint8 *puVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  uint8 *puVar4;
  uchar *puVar5;
  long lVar6;
  uint8 *raw;
  size_t rawsize;
  LodePNGState state;
  uchar *local_248;
  uint32 local_240 [2];
  StreamFile local_238;
  LodePNGState local_228;
  
  local_238.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00148c40;
  local_238.file = (FILE *)0x0;
  iVar2 = StreamFile::open(&local_238,filename,0x134ffd);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    writePNG((rw *)filename);
  }
  else {
    local_248 = (uchar *)0x0;
    lodepng_state_init(&local_228);
    puVar4 = image->pixels;
    iVar2 = image->depth;
    switch(iVar2 << 0x1e | iVar2 - 4U >> 2) {
    case 0:
      local_228.info_raw.colortype = LCT_PALETTE;
      local_228.info_raw.bitdepth = 4;
      local_228.info_png.color.colortype = LCT_PALETTE;
      local_228.info_png.color.bitdepth = 4;
      local_228.encoder.auto_convert = 0;
      if (iVar2 != 0x1f) {
        lVar6 = 0;
        do {
          puVar4 = image->palette;
          lodepng_palette_add(&local_228.info_png.color,puVar4[lVar6 * 4],puVar4[lVar6 * 4 + 1],
                              puVar4[lVar6 * 4 + 2],puVar4[lVar6 * 4 + 3]);
          lodepng_palette_add(&local_228.info_raw,puVar4[lVar6 * 4],puVar4[lVar6 * 4 + 1],
                              puVar4[lVar6 * 4 + 2],puVar4[lVar6 * 4 + 3]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < 1 << ((byte)image->depth & 0x1f));
      }
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/png.cpp line: 111"
      ;
      puVar4 = (uint8 *)(*DAT_00149de8)((long)(image->width / 2) * (long)image->height,0x10018);
      srcstride = image->width;
      compressPal4_BE(puVar4,(int)srcstride / 2,image->pixels,srcstride,srcstride,image->height);
      break;
    case 1:
      local_228.info_raw.colortype = LCT_PALETTE;
      local_228.info_png.color.colortype = LCT_PALETTE;
      local_228.encoder.auto_convert = 0;
      if (iVar2 != 0x1f) {
        lVar6 = 0;
        do {
          puVar1 = image->palette;
          lodepng_palette_add(&local_228.info_png.color,puVar1[lVar6 * 4],puVar1[lVar6 * 4 + 1],
                              puVar1[lVar6 * 4 + 2],puVar1[lVar6 * 4 + 3]);
          lodepng_palette_add(&local_228.info_raw,puVar1[lVar6 * 4],puVar1[lVar6 * 4 + 1],
                              puVar1[lVar6 * 4 + 2],puVar1[lVar6 * 4 + 3]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < 1 << ((byte)image->depth & 0x1f));
      }
      break;
    case 3:
      Image::convertTo32(image);
      break;
    case 5:
      local_228.info_raw.colortype = LCT_RGB;
      local_228.info_png.color.colortype = LCT_RGB;
      local_228.encoder.auto_convert = 0;
    }
    uVar3 = lodepng_encode(&local_248,(size_t *)local_240,puVar4,image->width,image->height,
                           &local_228);
    if (uVar3 == 0) {
      if (puVar4 != image->pixels) {
        (*DAT_00149de0)(puVar4);
      }
      puVar5 = local_248;
      StreamFile::write8(&local_238,local_248,local_240[0]);
      StreamFile::close(&local_238,(int)puVar5);
      free(local_248);
    }
    else {
      writePNG((rw *)(ulong)uVar3);
    }
  }
  return;
}

Assistant:

void
writePNG(Image *image, const char *filename)
{
	int32 i;
	StreamFile file;
	if(!file.open(filename, "wb")){
		RWERROR((ERR_FILE, filename));
		return;
	}

	size_t rawsize;
	uint8 *raw = nil;
	uint8 *pixels;
	LodePNGState state;
	lodepng_state_init(&state);

	pixels = image->pixels;
	switch(image->depth){
	case 4:
		state.info_raw.bitdepth = 4;
		state.info_raw.colortype = LCT_PALETTE;
		state.info_png.color.bitdepth = 4;
		state.info_png.color.colortype = LCT_PALETTE;
		state.encoder.auto_convert = 0;
		for(i = 0; i < (1<<image->depth); i++){
			uint8 *col = &image->palette[i*4];
			lodepng_palette_add(&state.info_png.color, col[0], col[1], col[2], col[3]);
			lodepng_palette_add(&state.info_raw, col[0], col[1], col[2], col[3]);
		}
		pixels = rwNewT(uint8, image->width/2*image->height, ID_IMAGE | MEMDUR_FUNCTION);
		compressPal4_BE(pixels, image->width/2, image->pixels, image->width, image->width, image->height);
		break;
	case 8:
		state.info_raw.colortype = LCT_PALETTE;
		state.info_png.color.colortype = LCT_PALETTE;
		state.encoder.auto_convert = 0;
		for(i = 0; i < (1<<image->depth); i++){
			uint8 *col = &image->palette[i*4];
			lodepng_palette_add(&state.info_png.color, col[0], col[1], col[2], col[3]);
			lodepng_palette_add(&state.info_raw, col[0], col[1], col[2], col[3]);
		}
		break;
	case 16:
		// Don't think we can have 16 bits with PNG
		// TODO: don't change original image
		image->convertTo32();
		break;
	case 24:
		state.info_raw.colortype = LCT_RGB;
		state.info_png.color.colortype = LCT_RGB;
		state.encoder.auto_convert = 0;
		break;
	case 32:
		// already done
		break;
	}

	uint32 error = lodepng_encode(&raw, &rawsize, pixels, image->width, image->height, &state);
	if(error){
		RWERROR((ERR_GENERAL, lodepng_error_text(error)));
		return;
	}
	if(pixels != image->pixels)
		rwFree(pixels);
	file.write8(raw, rawsize);
	file.close();
	free(raw);
}